

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Tag::Write(Tag *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t stop;
  SimpleTag *st_1;
  int idx_1;
  int64_t start;
  uint64_t tag_size;
  SimpleTag *st;
  uint64 uStack_28;
  int idx;
  uint64_t payload_size;
  IMkvWriter *writer_local;
  Tag *this_local;
  
  uStack_28 = 0;
  for (st._4_4_ = 0; st._4_4_ < this->simple_tags_count_; st._4_4_ = st._4_4_ + 1) {
    uVar4 = SimpleTag::Write(this->simple_tags_ + st._4_4_,(IMkvWriter *)0x0);
    uStack_28 = uVar4 + uStack_28;
  }
  uVar5 = EbmlMasterElementSize(0x7373,uStack_28);
  this_local = (Tag *)(uVar5 + uStack_28);
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])();
    bVar1 = WriteEbmlMasterElement(writer,0x7373,uStack_28);
    if (bVar1) {
      for (st_1._4_4_ = 0; st_1._4_4_ < this->simple_tags_count_; st_1._4_4_ = st_1._4_4_ + 1) {
        uVar4 = SimpleTag::Write(this->simple_tags_ + st_1._4_4_,writer);
        if (uVar4 == 0) {
          return 0;
        }
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])();
      if ((CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) &&
         ((Tag *)(CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2)) != this_local)) {
        this_local = (Tag *)0x0;
      }
    }
    else {
      this_local = (Tag *)0x0;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Tag::Write(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];
    payload_size += st.Write(NULL);
  }

  const uint64_t tag_size =
      EbmlMasterElementSize(libwebm::kMkvTag, payload_size) + payload_size;

  if (writer == NULL)
    return tag_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTag, payload_size))
    return 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];

    if (!st.Write(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != tag_size)
    return 0;

  return tag_size;
}